

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

void Extra_zddDumpPla(DdManager *dd,DdNode *F,int nVars,char *pFileName)

{
  int iVar1;
  int *in_RAX;
  FILE *__s;
  void *__ptr;
  DdGen *gen;
  ulong uVar2;
  undefined1 uVar3;
  int *pPath;
  
  pPath = in_RAX;
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  fwrite("# PLA file dumped by Extra_zddDumpPla() in ABC\n",0x2f,1,__s);
  fprintf(__s,".i %d\n",(ulong)(uint)nVars);
  fwrite(".o 1\n",5,1,__s);
  __ptr = calloc((long)dd->sizeZ,1);
  gen = Cudd_zddFirstPath(dd,F,&pPath);
  if (nVars < 1) {
    nVars = 0;
  }
  do {
    iVar1 = Cudd_IsGenEmpty(gen);
    if (iVar1 != 0) {
      iVar1 = Cudd_GenFree(gen);
      if (iVar1 == 0) {
        fwrite(".e\n\n",4,1,__s);
        fclose(__s);
        free(__ptr);
        return;
      }
    }
    for (uVar2 = 0; (uint)nVars != uVar2; uVar2 = uVar2 + 1) {
      *(undefined1 *)((long)__ptr + uVar2) = 0x2d;
    }
    for (uVar2 = 0; (uint)nVars != uVar2; uVar2 = uVar2 + 1) {
      uVar3 = 0x31;
      if ((pPath[uVar2 * 2] == 1) || (uVar3 = 0x30, pPath[uVar2 * 2 + 1] == 1)) {
        *(undefined1 *)((long)__ptr + uVar2) = uVar3;
      }
    }
    fprintf(__s,"%s 1\n",__ptr);
    Cudd_zddNextPath(gen,&pPath);
  } while( true );
}

Assistant:

void Extra_zddDumpPla( DdManager * dd, DdNode * F, int nVars, char * pFileName )
{
    DdGen *gen;
    char * pCube;
    int * pPath, i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    fprintf( pFile, "# PLA file dumped by Extra_zddDumpPla() in ABC\n" );
    fprintf( pFile, ".i %d\n", nVars );
    fprintf( pFile, ".o 1\n" );
    pCube = ABC_CALLOC( char, dd->sizeZ );
    Cudd_zddForeachPath( dd, F, gen, pPath )
    {
        for ( i = 0; i < nVars; i++ )
            pCube[i] = '-';
        for ( i = 0; i < nVars; i++ )
            if ( pPath[2*i] == 1 || pPath[2*i+1] == 1 )
                pCube[i] = '0' + (pPath[2*i] == 1);
        fprintf( pFile, "%s 1\n", pCube );           
    }
    fprintf( pFile, ".e\n\n" );
    fclose( pFile );
    ABC_FREE( pCube );
}